

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

void __thiscall jbcoin::STAmount::set(STAmount *this,int64_t v)

{
  int64_t v_local;
  STAmount *this_local;
  
  if (v < 0) {
    this->mIsNegative = true;
    this->mValue = -v;
  }
  else {
    this->mIsNegative = false;
    this->mValue = v;
  }
  return;
}

Assistant:

void STAmount::set (std::int64_t v)
{
    if (v < 0)
    {
        mIsNegative = true;
        mValue = static_cast<std::uint64_t>(-v);
    }
    else
    {
        mIsNegative = false;
        mValue = static_cast<std::uint64_t>(v);
    }
}